

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

int64_t absl::lts_20240722::anon_unknown_1::IDivSlowPath
                  (bool satq,Duration num,Duration den,Duration *rem)

{
  uint128 lhs;
  uint128 lhs_00;
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  undefined1 is_neg;
  bool bVar4;
  Duration DVar5;
  uint128 uVar6;
  uint128 uVar7;
  uint128 u128;
  uint128 local_388;
  uint64_t local_378;
  uint64_t local_370;
  uint128 local_368;
  uint64_t local_358;
  uint64_t local_350;
  uint128 local_348;
  uint64_t local_338;
  uint64_t local_330;
  Duration local_328;
  anon_unknown_1 *local_318;
  uint64_t uStack_310;
  HiRep local_304;
  uint32_t local_2fc;
  uint64_t local_2f8;
  uint64_t uStack_2f0;
  uint64_t local_2e8;
  uint64_t uStack_2e0;
  uint128 local_2d8;
  uint64_t local_2c8;
  uint64_t uStack_2c0;
  undefined1 auStack_2b8 [8];
  uint128 remainder128;
  uint64_t local_2a0;
  uint128 local_298;
  uint64_t local_288;
  uint64_t local_280;
  uint64_t local_278;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  undefined1 auStack_258 [8];
  uint128 quotient128;
  uint64_t uStack_228;
  uint128 b;
  uint64_t uStack_1f8;
  uint128 a;
  HiRep local_1c8;
  uint32_t local_1c0;
  HiRep local_1b8;
  uint32_t local_1b0;
  HiRep local_17c;
  uint32_t local_174;
  bool quotient_neg;
  bool den_neg;
  bool num_neg;
  Duration *rem_local;
  bool satq_local;
  Duration den_local;
  Duration num_local;
  
  DVar5 = ZeroDuration();
  bVar1 = operator<(num,DVar5);
  DVar5 = ZeroDuration();
  bVar2 = operator<(den,DVar5);
  bVar4 = bVar1 != bVar2;
  bVar2 = time_internal::IsInfiniteDuration(num);
  if (!bVar2) {
    DVar5 = ZeroDuration();
    bVar2 = operator==(den,DVar5);
    if (!bVar2) {
      bVar2 = time_internal::IsInfiniteDuration(den);
      if (bVar2) {
        rem->rep_hi_ = num.rep_hi_;
        rem->rep_lo_ = num.rep_lo_;
        return 0;
      }
      uVar6 = MakeU128Ticks(num);
      unique0x10000624 = den.rep_hi_;
      uVar7 = MakeU128Ticks(den);
      uStack_1f8 = uVar6.lo_;
      local_268 = uStack_1f8;
      a.lo_ = uVar6.hi_;
      local_260 = a.lo_;
      uStack_228 = uVar7.lo_;
      local_278 = uStack_228;
      b.lo_ = uVar7.hi_;
      local_270 = b.lo_;
      _auStack_258 = operator/(uVar6,uVar7);
      if (satq) {
        local_288 = (uint64_t)auStack_258;
        local_280 = quotient128.lo_;
        uint128::uint128(&local_298,0x7fffffffffffffff);
        uVar6.hi_ = local_280;
        uVar6.lo_ = local_288;
        bVar2 = operator>(uVar6,local_298);
        if (bVar2) {
          if (bVar4) {
            uint128::uint128((uint128 *)&remainder128.hi_,0x8000000000000000);
          }
          else {
            uint128::uint128((uint128 *)&remainder128.hi_,0x7fffffffffffffff);
          }
          quotient128.lo_ = local_2a0;
          auStack_258 = (undefined1  [8])remainder128.hi_;
        }
      }
      local_2c8 = uStack_1f8;
      uStack_2c0 = a.lo_;
      local_2e8 = (uint64_t)auStack_258;
      uStack_2e0 = quotient128.lo_;
      local_2f8 = uStack_228;
      uStack_2f0 = b.lo_;
      local_2d8 = operator*(_auStack_258,uVar7);
      uVar7.hi_ = uStack_2c0;
      uVar7.lo_ = local_2c8;
      is_neg = (undefined1)local_2d8.hi_;
      _auStack_2b8 = operator-(uVar7,local_2d8);
      local_318 = (anon_unknown_1 *)auStack_2b8;
      uStack_310 = remainder128.lo_;
      u128.hi_._0_1_ = bVar1;
      u128.lo_ = remainder128.lo_;
      u128.hi_._1_7_ = 0;
      local_328 = MakeDurationFromU128((anon_unknown_1 *)auStack_2b8,u128,(bool)is_neg);
      local_304 = local_328.rep_hi_;
      local_2fc = local_328.rep_lo_;
      rem->rep_hi_ = local_328.rep_hi_;
      rem->rep_lo_ = local_328.rep_lo_;
      if (bVar4) {
        local_338 = (uint64_t)auStack_258;
        local_330 = quotient128.lo_;
        uint128::uint128(&local_348,0);
        lhs_00.hi_ = local_330;
        lhs_00.lo_ = local_338;
        bVar1 = operator==(lhs_00,local_348);
        if (!bVar1) {
          local_378 = (uint64_t)auStack_258;
          local_370 = quotient128.lo_;
          uint128::uint128(&local_388,1);
          lhs.hi_ = local_370;
          lhs.lo_ = local_378;
          local_368 = operator-(lhs,local_388);
          uVar3 = Uint128Low64(local_368);
          return -1 - (uVar3 & 0x7fffffffffffffff);
        }
      }
      local_358 = (uint64_t)auStack_258;
      local_350 = quotient128.lo_;
      uVar3 = Uint128Low64(_auStack_258);
      return uVar3 & 0x7fffffffffffffff;
    }
  }
  if (bVar1) {
    DVar5 = InfiniteDuration();
    DVar5 = operator-(DVar5);
    local_1b8 = DVar5.rep_hi_;
    local_17c = local_1b8;
    local_1b0 = DVar5.rep_lo_;
    local_174 = local_1b0;
  }
  else {
    DVar5 = InfiniteDuration();
    local_1c8 = DVar5.rep_hi_;
    local_17c = local_1c8;
    local_1c0 = DVar5.rep_lo_;
    local_174 = local_1c0;
  }
  rem->rep_hi_ = local_17c;
  rem->rep_lo_ = local_174;
  register0x00000000 = 0x7fffffffffffffff;
  if (bVar4) {
    register0x00000000 = -0x8000000000000000;
  }
  return stack0xfffffffffffffff0;
}

Assistant:

int64_t IDivSlowPath(bool satq, const Duration num, const Duration den,
                     Duration* rem) {
  const bool num_neg = num < ZeroDuration();
  const bool den_neg = den < ZeroDuration();
  const bool quotient_neg = num_neg != den_neg;

  if (time_internal::IsInfiniteDuration(num) || den == ZeroDuration()) {
    *rem = num_neg ? -InfiniteDuration() : InfiniteDuration();
    return quotient_neg ? kint64min : kint64max;
  }
  if (time_internal::IsInfiniteDuration(den)) {
    *rem = num;
    return 0;
  }

  const uint128 a = MakeU128Ticks(num);
  const uint128 b = MakeU128Ticks(den);
  uint128 quotient128 = a / b;

  if (satq) {
    // Limits the quotient to the range of int64_t.
    if (quotient128 > uint128(static_cast<uint64_t>(kint64max))) {
      quotient128 = quotient_neg ? uint128(static_cast<uint64_t>(kint64min))
                                 : uint128(static_cast<uint64_t>(kint64max));
    }
  }

  const uint128 remainder128 = a - quotient128 * b;
  *rem = MakeDurationFromU128(remainder128, num_neg);

  if (!quotient_neg || quotient128 == 0) {
    return Uint128Low64(quotient128) & kint64max;
  }
  // The quotient needs to be negated, but we need to carefully handle
  // quotient128s with the top bit on.
  return -static_cast<int64_t>(Uint128Low64(quotient128 - 1) & kint64max) - 1;
}